

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

int tlp_calculate_length(uintptr_t addr,size_t count)

{
  return ((int)((count + addr) - (addr & 0x3fffffffc) >> 2) + 1) - (uint)((count + addr & 3) == 0);
}

Assistant:

int tlp_calculate_length(uintptr_t addr, size_t count)
{
	size_t len = 0;
	uintptr_t start, end;

	start = addr & 0xFFFFFFFFFFFFFFFc;
	end = addr + count;

	len = (end - start) >> 2;

	if ((end - start) & 0x3)
		len++;

	return len;
}